

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O3

SQTable * CreateDefaultDelegate(SQSharedState *ss,SQRegFunction *funcz)

{
  SQUnsignedInteger *pSVar1;
  SQRegFunction *pSVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  bool bVar5;
  SQTable *this;
  SQObjectValue SVar6;
  SQString *pSVar7;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  this = (SQTable *)sq_vm_malloc(0x58);
  SQTable::SQTable(this,ss,0);
  (this->super_SQDelegable)._delegate = (SQTable *)0x0;
  if (funcz->name != (SQChar *)0x0) {
    do {
      SVar6.pNativeClosure = SQNativeClosure::Create(ss,funcz->f,0);
      ((SVar6.pTable)->super_SQDelegable)._delegate = (SQTable *)funcz->nparamscheck;
      pSVar7 = SQString::Create(ss,funcz->name,-1);
      pSVar4 = ((SQObjectValue *)&((SVar6.pGenerator)->_ci)._generator)->pTable;
      SVar3 = ((SVar6.pNativeClosure)->_name).super_SQObject._type;
      ((SVar6.pNativeClosure)->_name).super_SQObject._type = OT_STRING;
      ((SQObjectValue *)&((SVar6.pGenerator)->_ci)._generator)->pString = pSVar7;
      pSVar1 = &(pSVar7->super_SQRefCounted)._uiRef;
      *pSVar1 = *pSVar1 + 1;
      if ((SVar3 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      if ((funcz->typemask != (SQChar *)0x0) &&
         (bVar5 = CompileTypemask(&(SVar6.pNativeClosure)->_typecheck,funcz->typemask), !bVar5)) {
        return (SQTable *)0x0;
      }
      local_40.super_SQObject._unVal.pString = SQString::Create(ss,funcz->name,-1);
      local_40.super_SQObject._type = OT_STRING;
      pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      local_50.super_SQObject._type = OT_NATIVECLOSURE;
      pSVar1 = &((SVar6.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      local_50.super_SQObject._unVal.pNativeClosure = SVar6.pNativeClosure;
      SQTable::NewSlot(this,&local_40,&local_50);
      SQObjectPtr::~SQObjectPtr(&local_50);
      SQObjectPtr::~SQObjectPtr(&local_40);
      pSVar2 = funcz + 1;
      funcz = funcz + 1;
    } while (pSVar2->name != (SQChar *)0x0);
  }
  return this;
}

Assistant:

SQTable *CreateDefaultDelegate(SQSharedState *ss,const SQRegFunction *funcz)
{
    SQInteger i=0;
    SQTable *t=SQTable::Create(ss,0);
    while(funcz[i].name!=0){
        SQNativeClosure *nc = SQNativeClosure::Create(ss,funcz[i].f,0);
        nc->_nparamscheck = funcz[i].nparamscheck;
        nc->_name = SQString::Create(ss,funcz[i].name);
        if(funcz[i].typemask && !CompileTypemask(nc->_typecheck,funcz[i].typemask))
            return NULL;
        t->NewSlot(SQString::Create(ss,funcz[i].name),nc);
        i++;
    }
    return t;
}